

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageIO.cpp
# Opt level: O0

void tcu::ImageIO::loadImage(TextureLevel *dst,Archive *archive,char *fileName)

{
  bool bVar1;
  InternalError *this;
  FilePath local_60;
  undefined1 local_40 [8];
  string ext;
  char *fileName_local;
  Archive *archive_local;
  TextureLevel *dst_local;
  
  ext.field_2._8_8_ = fileName;
  de::FilePath::FilePath(&local_60,fileName);
  de::FilePath::getFileExtension_abi_cxx11_((string *)local_40,&local_60);
  de::FilePath::~FilePath(&local_60);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"png");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"PNG");
    if (!bVar1) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (this,"Unrecognized image file extension",(char *)ext.field_2._8_8_,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
                 ,0x3e);
      __cxa_throw(this,&InternalError::typeinfo,InternalError::~InternalError);
    }
  }
  loadPNG(dst,archive,(char *)ext.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void loadImage (TextureLevel& dst, const tcu::Archive& archive, const char* fileName)
{
	string ext = de::FilePath(fileName).getFileExtension();

	if (ext == "png" || ext == "PNG")
		loadPNG(dst, archive, fileName);
	else
		throw InternalError("Unrecognized image file extension", fileName, __FILE__, __LINE__);
}